

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::InputFile::rawTileData
          (InputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  element_type *peVar1;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_198 [376];
  
  peVar1 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->_storage | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    TiledInputFile::rawTileData
              ((TiledInputFile *)
               (peVar1->_tFile)._M_t.
               super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
               .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>,dx,dy,lx,ly,pixelData,
               pixelDataSize);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::operator<<(local_198,"Tried to read a raw tile from a scanline-based image.");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::rawTileData (
    int&         dx,
    int&         dy,
    int&         lx,
    int&         ly,
    const char*& pixelData,
    int&         pixelDataSize)
{
    try
    {
        if (_data->_storage != EXR_STORAGE_TILED &&
            _data->_storage != EXR_STORAGE_DEEP_TILED)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Tried to read a raw tile "
                "from a scanline-based image.");
        }

        _data->_tFile->rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading tile data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}